

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gizmo.c
# Opt level: O0

void golf_gizmo_update(golf_gizmo_t *gizmo,ImDrawList *draw_list)

{
  golf_transform_t *pgVar1;
  vec3 *pvVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar17;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  vec2 vVar30;
  vec2 vVar31;
  vec2 vVar32;
  vec2 vVar33;
  vec2 vVar34;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  vec4 color_00;
  vec3 vVar35;
  vec3 v1;
  vec3 axis_00;
  vec3 v1_00;
  vec3 axis_01;
  vec3 v1_01;
  vec3 axis_02;
  vec3 v1_02;
  vec3 axis_03;
  vec3 v2;
  vec3 v1_03;
  vec4 color_01;
  vec4 color_02;
  vec3 v1_04;
  vec3 p_00;
  vec3 v1_05;
  vec3 v2_00;
  vec3 v1_06;
  vec3 v2_01;
  vec3 p_01;
  vec3 v2_02;
  vec3 v1_07;
  vec3 v2_03;
  vec3 v1_08;
  vec3 v1_09;
  vec3 v2_04;
  vec3 v;
  vec3 vVar36;
  vec3 vVar37;
  vec3 v1_10;
  vec3 plane_normal;
  vec3 plane_point;
  vec4 color_03;
  vec4 color_04;
  vec3 v_00;
  vec3 v_01;
  vec3 v1_11;
  vec3 p_02;
  vec3 p_03;
  vec3 p1_00;
  vec3 v_02;
  _Bool _Var38;
  golf_inputs_t *pgVar39;
  golf_graphics_t *pgVar40;
  long lVar41;
  float fVar42;
  float fVar44;
  float fVar43;
  vec3 vVar45;
  vec3 vVar46;
  vec3 vVar47;
  vec3 vVar48;
  vec3 vVar49;
  vec3 vVar50;
  vec4 vVar51;
  quat qVar52;
  quat qVar53;
  float r_2;
  undefined8 local_141c;
  vec4 col_3;
  float thickness_2;
  vec2 p1_4;
  vec2 p0_2;
  int i_6;
  golf_transform_t local_12f0;
  undefined8 local_12c8;
  float local_12c0;
  undefined8 local_12b8;
  float local_12b0;
  undefined8 local_12a8;
  float local_12a0;
  undefined8 local_1294;
  float local_128c;
  undefined8 local_1288;
  float local_1280;
  undefined8 local_1278;
  float local_1270;
  undefined8 local_1268;
  float local_1260;
  undefined8 local_1258;
  float local_1250;
  undefined8 local_1248;
  float local_1240;
  undefined8 local_1238;
  float local_1230;
  undefined8 local_1228;
  vec3 scale;
  float local_1214;
  int axis_i_2;
  int hovered_axis_2;
  float screen_dist_2;
  undefined1 local_1198 [8];
  vec3 c2_1;
  vec3 c1_1;
  float t_3;
  float s_1;
  vec3 q2_1;
  vec3 p2_1;
  vec3 q1_1;
  vec3 p1_3;
  int i_5;
  vec3 closest_point_1 [3];
  float local_107c;
  float closest_dist_2;
  int closest_axis_2;
  vec2 p1_2;
  vec2 p0_1;
  vec3 dir;
  float t1;
  float t0;
  int j;
  vec3 pt;
  int n;
  float thickness_1;
  undefined8 local_dac;
  vec4 col_2;
  int i_4;
  golf_transform_t local_d28;
  undefined8 local_d00;
  vec4 col_1;
  vec3 p_1;
  int local_c24;
  float t_2;
  int i_3;
  vec2 local_c08;
  vec2 points [25];
  int num_points;
  quat rotation;
  float local_ae8;
  undefined1 auStack_ae4 [4];
  float r_angle_1;
  vec3 r_axis_1;
  quat r_1;
  vec3 dir1_1;
  vec3 dir0_1;
  int axis_i_1;
  int hovered_axis_1;
  float hover_dist;
  float local_988;
  float screen_dist_1;
  float r_angle;
  vec3 r_axis;
  quat r;
  vec3 plane_p;
  int local_788;
  float local_784;
  int idx;
  float t_1;
  float local_778;
  undefined8 local_770;
  float local_768;
  vec3 local_760;
  undefined8 local_750;
  float local_748;
  undefined8 local_740;
  float local_738;
  undefined8 local_730;
  float local_728;
  vec3 local_720;
  undefined8 local_710;
  float local_708;
  undefined8 local_700;
  float local_6f8;
  undefined8 local_6f0;
  float local_6e8;
  undefined8 local_6e0;
  float local_6d8;
  undefined8 local_6d0;
  float local_6c8;
  undefined8 local_6c0;
  float local_6b8;
  vec3 local_6b0;
  undefined8 local_6a0;
  float local_698;
  undefined8 local_690;
  float local_688;
  int local_684;
  float local_680;
  int i_2;
  float closest_dist_1;
  int closest_axis_1;
  vec3 circle_p [3];
  vec3 circle_p0 [3];
  undefined1 auStack_618 [4];
  float cr;
  vec3 cc;
  vec3 rd;
  vec3 ro;
  vec2 t_p2;
  vec2 t_p1;
  vec2 t_p0;
  vec2 dir1;
  vec2 dir0;
  float h;
  float w;
  undefined8 local_574;
  vec4 col;
  float thickness;
  vec2 p1_1;
  vec2 p0;
  int i_1;
  golf_transform_t local_448;
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  undefined8 local_3ec;
  float local_3e4;
  undefined8 local_3e0;
  float local_3d8;
  undefined8 local_3d0;
  float local_3c8;
  undefined8 local_3c0;
  float local_3b8;
  undefined8 local_3b0;
  float local_3a8;
  float local_39c;
  undefined8 uStack_398;
  float dist;
  float local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  vec3 translate;
  float local_354;
  int axis_i;
  int hovered_axis;
  float screen_dist;
  undefined1 local_2d8 [8];
  vec3 c2;
  vec3 c1;
  float t;
  float s;
  vec3 q2;
  vec3 p2;
  vec3 q1;
  vec3 p1;
  int i;
  vec3 closest_point [3];
  float local_1bc;
  float closest_dist;
  int closest_axis;
  vec4 color [3];
  vec3 axis [3];
  undefined4 uStack_9c;
  mat4 model_mat;
  float dist_modifier;
  vec3 p;
  golf_graphics_t *graphics;
  golf_inputs_t *inputs;
  ImDrawList *draw_list_local;
  golf_gizmo_t *gizmo_local;
  
  if ((gizmo->is_on & 1U) != 0) {
    pgVar39 = golf_inputs_get();
    pgVar40 = golf_graphics_get();
    fVar43 = (gizmo->transform).position.z;
    pgVar1 = &gizmo->transform;
    vVar37 = pgVar1->position;
    vVar36 = pgVar1->position;
    vVar47 = pgVar1->position;
    vVar46 = pgVar1->position;
    vVar50 = pgVar1->position;
    vVar35 = pgVar1->position;
    vVar49 = pgVar1->position;
    vVar48 = pgVar1->position;
    fVar42 = vec3_distance(pgVar40->cam_pos,pgVar1->position);
    fVar42 = fVar42 * 0.1;
    mat4_from_quat((mat4 *)&axis[2].z,(gizmo->transform).rotation);
    vVar45 = vec3_create(1.0,0.0,0.0);
    m.m._8_8_ = model_mat.m._0_8_;
    m.m[0] = axis[2].z;
    m.m[1] = (float)uStack_9c;
    m.m._16_8_ = model_mat.m._8_8_;
    m.m._24_8_ = model_mat.m._16_8_;
    m.m._32_8_ = model_mat.m._24_8_;
    m.m._40_8_ = model_mat.m._32_8_;
    m.m._48_8_ = model_mat.m._40_8_;
    m.m._56_8_ = model_mat.m._48_8_;
    vVar45 = vec3_apply_mat4(vVar45,0.0,m);
    axis[0].x = vVar45.z;
    vVar45 = vec3_create(0.0,1.0,0.0);
    m_00.m._8_8_ = model_mat.m._0_8_;
    m_00.m[0] = axis[2].z;
    m_00.m[1] = (float)uStack_9c;
    m_00.m._16_8_ = model_mat.m._8_8_;
    m_00.m._24_8_ = model_mat.m._16_8_;
    m_00.m._32_8_ = model_mat.m._24_8_;
    m_00.m._40_8_ = model_mat.m._32_8_;
    m_00.m._48_8_ = model_mat.m._40_8_;
    m_00.m._56_8_ = model_mat.m._48_8_;
    vVar45 = vec3_apply_mat4(vVar45,0.0,m_00);
    axis[1].x = vVar45.z;
    axis[0]._4_8_ = vVar45._0_8_;
    vVar45 = vec3_create(0.0,0.0,1.0);
    m_01.m._8_8_ = model_mat.m._0_8_;
    m_01.m[0] = axis[2].z;
    m_01.m[1] = (float)uStack_9c;
    m_01.m._16_8_ = model_mat.m._8_8_;
    m_01.m._24_8_ = model_mat.m._16_8_;
    m_01.m._32_8_ = model_mat.m._24_8_;
    m_01.m._40_8_ = model_mat.m._32_8_;
    m_01.m._48_8_ = model_mat.m._40_8_;
    m_01.m._56_8_ = model_mat.m._48_8_;
    vVar45 = vec3_apply_mat4(vVar45,0.0,m_01);
    axis[2].x = vVar45.z;
    color[2]._8_8_ = vVar45._0_8_;
    axis[1]._4_8_ = color[2]._8_8_;
    vVar51 = vec4_create(1.0,0.0,0.0,1.0);
    color[0]._0_8_ = vVar51._8_8_;
    _closest_dist = vVar51._0_8_;
    vVar51 = vec4_create(0.0,1.0,0.0,1.0);
    color[0]._8_8_ = vVar51._0_8_;
    color[1]._0_8_ = vVar51._8_8_;
    vVar51 = vec4_create(0.0,0.0,1.0,1.0);
    color[1].z = (float)vVar51._0_8_;
    color[1].w = SUB84(vVar51._0_8_,4);
    color[2].x = (float)vVar51._8_8_;
    color[2].y = SUB84(vVar51._8_8_,4);
    if (gizmo->operation == GOLF_GIZMO_TRANSLATE) {
      local_1bc = -NAN;
      closest_point[2].z = 3.4028235e+38;
      for (p1.y = 0.0; (int)p1.y < 3; p1.y = (float)((int)p1.y + 1)) {
        p1.x = (pgVar39->mouse_ray_orig).z;
        pvVar2 = &pgVar39->mouse_ray_orig;
        uVar5 = pvVar2->x;
        uVar18 = pvVar2->y;
        p1_00.y = (float)uVar18;
        p1_00.x = (float)uVar5;
        vVar46 = vec3_add(*pvVar2,pgVar39->mouse_ray_dir);
        uVar6 = axis[(long)(int)p1.y + -1].y;
        uVar19 = axis[(long)(int)p1.y + -1].z;
        v_02.y = (float)uVar19;
        v_02.x = (float)uVar6;
        v_02.z = axis[(int)p1.y].x;
        vVar47 = vec3_scale(v_02,fVar42);
        vVar47 = vec3_add(vVar48,vVar47);
        p1_00.z = p1.x;
        closest_point_ray_ray
                  (p1_00,vVar46,vVar49,vVar47,&c1.z,&c1.y,(vec3 *)&c2.y,(vec3 *)local_2d8);
        p_03.z = c1.x;
        p_03.x = c2.y;
        p_03.y = c2.z;
        vVar30 = _world_to_screen(p_03);
        p_02.z = c2.x;
        p_02.x = (float)local_2d8._0_4_;
        p_02.y = (float)local_2d8._4_4_;
        vVar31 = _world_to_screen(p_02);
        fVar43 = vec2_distance(vVar30,vVar31);
        if (((0.0 <= c1.y) && (c1.y <= 1.4)) && (fVar43 < closest_point[2].z)) {
          closest_point[2].z = fVar43;
          local_1bc = p1.y;
        }
        *(undefined1 (*) [8])&(&p1)[(int)p1.y].z = local_2d8;
        closest_point[(int)p1.y].x = c2.x;
      }
      local_354 = -NAN;
      if (closest_point[2].z < 8.0) {
        local_354 = local_1bc;
      }
      if ((gizmo->is_active & 1U) == 0) {
        if ((-1 < (int)local_354) && ((pgVar39->mouse_down[0] & 1U) != 0)) {
          gizmo->is_active = true;
          (gizmo->translate).axis = (int)local_354;
          (gizmo->translate).start_point.z = closest_point[(int)local_354].x;
          uVar17 = *(undefined8 *)&(&p1)[(int)local_354].z;
          (gizmo->translate).start_point.x = (float)(int)uVar17;
          (gizmo->translate).start_point.y = (float)(int)((ulong)uVar17 >> 0x20);
          (gizmo->translate).start_position.z = (gizmo->transform).position.z;
          fVar43 = (gizmo->transform).position.y;
          (gizmo->translate).start_position.x = (gizmo->transform).position.x;
          (gizmo->translate).start_position.y = fVar43;
          vVar48 = vec3_create(0.0,0.0,0.0);
          vVar49 = vec3_create(0.0,0.0,0.0);
          qVar52 = quat_create(0.0,0.0,0.0,1.0);
          golf_transform(&local_448,vVar48,vVar49,qVar52);
          memcpy(&gizmo->delta_transform,&local_448,0x28);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if ((pgVar39->mouse_down[0] & 1U) == 0) {
          gizmo->is_active = false;
        }
        translate.z = (float)(gizmo->translate).axis;
        local_370 = closest_point[(int)translate.z].x;
        local_378 = *(undefined8 *)&(&p1)[(int)translate.z].z;
        v1_11.z = closest_point[(int)translate.z].x;
        v1_11.x = (float)(int)local_378;
        v1_11.y = (float)(int)((ulong)local_378 >> 0x20);
        local_380 = (gizmo->translate).start_point.z;
        pvVar2 = &(gizmo->translate).start_point;
        local_388._0_4_ = pvVar2->x;
        local_388._4_4_ = pvVar2->y;
        vVar48 = vec3_sub(v1_11,*pvVar2);
        local_3a8 = vVar48.z;
        local_3b0 = vVar48._0_8_;
        uStack_398 = local_3b0;
        local_390 = local_3a8;
        local_368 = local_3b0;
        translate.x = local_3a8;
        fVar43 = vec3_length(vVar48);
        local_39c = golf_snapf(fVar43,(gizmo->translate).snap);
        local_3c8 = translate.x;
        local_3d0 = local_368;
        v_01.z = translate.x;
        v_01.x = (float)(undefined4)local_368;
        v_01.y = (float)local_368._4_4_;
        vVar48 = vec3_set_length(v_01,local_39c);
        local_408 = vVar48.z;
        local_410 = vVar48._0_8_;
        local_3f8 = (gizmo->translate).start_position.z;
        pvVar2 = &(gizmo->translate).start_position;
        local_400._0_4_ = pvVar2->x;
        local_400._4_4_ = pvVar2->y;
        local_3e0 = local_410;
        local_3d8 = local_408;
        local_3c0 = local_410;
        local_3b8 = local_408;
        local_368 = local_410;
        translate.x = local_408;
        vVar48 = vec3_add(*pvVar2,vVar48);
        local_418 = vVar48.z;
        local_420 = vVar48._0_8_;
        (gizmo->transform).position.x = (float)(int)local_420;
        (gizmo->transform).position.y = (float)(int)((ulong)local_420 >> 0x20);
        (gizmo->transform).position.z = local_418;
        (gizmo->delta_transform).position.x = (float)(undefined4)local_368;
        (gizmo->delta_transform).position.y = (float)local_368._4_4_;
        (gizmo->delta_transform).position.z = translate.x;
        local_3ec = local_420;
        local_3e4 = local_418;
      }
      for (p0.x = 0.0; (int)p0.x < 3; p0.x = (float)((int)p0.x + 1)) {
        vVar30 = _world_to_screen(vVar35);
        uVar7 = axis[(long)(int)p0.x + -1].y;
        uVar20 = axis[(long)(int)p0.x + -1].z;
        v_00.y = (float)uVar20;
        v_00.x = (float)uVar7;
        v_00.z = axis[(int)p0.x].x;
        vVar48 = vec3_scale(v_00,fVar42);
        vVar48 = vec3_add(vVar50,vVar48);
        vVar31 = _world_to_screen(vVar48);
        local_574 = *(undefined8 *)(&closest_dist + (long)(int)p0.x * 4);
        col.x = color[(int)p0.x].x;
        col.y = color[(int)p0.x].y;
        if ((((gizmo->is_active & 1U) == 0) && (local_354 == p0.x)) ||
           (((gizmo->is_active & 1U) != 0 && (p0.x == (float)(gizmo->translate).axis)))) {
          vVar51 = vec4_create(1.0,1.0,0.0,1.0);
          col._0_8_ = vVar51._8_8_;
          local_574 = vVar51._0_8_;
        }
        color_03.z = col.x;
        color_03.w = col.y;
        color_03.x = (float)(undefined4)local_574;
        color_03.y = (float)local_574._4_4_;
        _add_line(draw_list,vVar30,vVar31,4.0,color_03);
        fVar43 = sqrtf(3.0);
        fVar43 = fVar43 * 0.5 * 15.0;
        vVar30 = vec2_sub(vVar31,vVar30);
        vVar30 = vec2_normalize(vVar30);
        vVar32 = vec2_rotate(vVar30,1.5707964);
        vVar33 = vec2_scale(vVar30,fVar43 * -0.5);
        vVar34 = vec2_scale(vVar32,-7.5);
        vVar33 = vec2_add(vVar33,vVar34);
        vVar33 = vec2_add(vVar31,vVar33);
        vVar34 = vec2_scale(vVar30,fVar43 * -0.5);
        vVar32 = vec2_scale(vVar32,7.5);
        vVar32 = vec2_add(vVar34,vVar32);
        vVar32 = vec2_add(vVar31,vVar32);
        vVar30 = vec2_scale(vVar30,fVar43 * 0.5);
        vVar30 = vec2_add(vVar31,vVar30);
        color_04.z = col.x;
        color_04.w = col.y;
        color_04.x = (float)(undefined4)local_574;
        color_04.y = (float)local_574._4_4_;
        _add_triangle(draw_list,vVar33,vVar32,vVar30,color_04);
      }
    }
    else if (gizmo->operation == GOLF_GIZMO_ROTATE) {
      pvVar2 = &pgVar39->mouse_ray_orig;
      fVar44 = (pgVar39->mouse_ray_orig).z;
      vVar35 = *pvVar2;
      vVar49 = *pvVar2;
      vVar48 = *pvVar2;
      cc.y = (pgVar39->mouse_ray_dir).x;
      cc.z = (pgVar39->mouse_ray_dir).y;
      fVar3 = (pgVar39->mouse_ray_dir).z;
      auStack_618 = (undefined1  [4])(pgVar1->position).x;
      cr = (pgVar1->position).y;
      cc.x = fVar43;
      fVar42 = fVar42 * 1.0;
      i_2 = -1;
      local_680 = 3.4028235e+38;
      for (local_684 = 0; local_684 < 3; local_684 = local_684 + 1) {
        lVar41 = (long)local_684;
        local_698 = fVar44;
        local_6a0._0_4_ = pvVar2->x;
        local_6a0._4_4_ = pvVar2->y;
        local_6b0.z = cc.x;
        local_6b0.x = (float)auStack_618;
        local_6b0.y = cr;
        plane_point.z = cc.x;
        plane_point.x = (float)auStack_618;
        plane_point.y = cr;
        local_6b8 = axis[lVar41].x;
        local_6c0._0_4_ = axis[lVar41 + -1].y;
        local_6c0._4_4_ = axis[lVar41 + -1].z;
        plane_normal.z = axis[lVar41].x;
        plane_normal.x = (float)(undefined4)local_6c0;
        plane_normal.y = (float)local_6c0._4_4_;
        vVar50 = closest_point_point_plane(vVar48,plane_point,plane_normal);
        local_6c8 = vVar50.z;
        local_6d0 = vVar50._0_8_;
        local_688 = local_6c8;
        local_690 = local_6d0;
        circle_p0[lVar41].x = local_6c8;
        circle_p0[lVar41 + -1].y = (float)(int)local_6d0;
        circle_p0[lVar41 + -1].z = (float)(int)((ulong)local_6d0 >> 0x20);
        lVar41 = (long)local_684;
        local_708 = circle_p0[lVar41].x;
        local_710._0_4_ = circle_p0[lVar41 + -1].y;
        local_710._4_4_ = circle_p0[lVar41 + -1].z;
        v1_10.z = circle_p0[lVar41].x;
        v1_10.x = (float)(undefined4)local_710;
        v1_10.y = (float)local_710._4_4_;
        local_720.z = cc.x;
        local_720.x = (float)auStack_618;
        local_720.y = cr;
        vVar45.z = cc.x;
        vVar45.x = (float)auStack_618;
        vVar45.y = cr;
        vVar50 = vec3_sub(v1_10,vVar45);
        local_738 = vVar50.z;
        local_740 = vVar50._0_8_;
        local_730 = local_740;
        local_728 = local_738;
        local_700 = local_740;
        local_6f8 = local_738;
        vVar50 = vec3_set_length(vVar50,fVar42);
        local_768 = vVar50.z;
        local_770 = vVar50._0_8_;
        local_760.z = cc.x;
        local_760.x = (float)auStack_618;
        local_760.y = cr;
        vVar37.z = cc.x;
        vVar37.x = (float)auStack_618;
        vVar37.y = cr;
        local_750 = local_770;
        local_748 = local_768;
        local_6f0 = local_770;
        local_6e8 = local_768;
        vVar50 = vec3_add(vVar37,vVar50);
        local_778 = vVar50.z;
        _idx = vVar50._0_8_;
        circle_p0[lVar41].x = local_778;
        circle_p0[lVar41 + -1].y = (float)(int)_idx;
        circle_p0[lVar41 + -1].z = (float)(int)((ulong)_idx >> 0x20);
        vVar36.z = fVar3;
        vVar36.x = cc.y;
        vVar36.y = cc.z;
        local_6e0 = _idx;
        local_6d8 = local_778;
        _Var38 = ray_intersect_planes
                           (vVar49,vVar36,(vec3 *)auStack_618,(vec3 *)&axis[(long)local_684 + -1].y,
                            1,&local_784,&local_788);
        if (_Var38) {
          v.z = fVar3;
          v.x = cc.y;
          v.y = cc.z;
          vVar50 = vec3_scale(v,local_784);
          vVar50 = vec3_add(vVar35,vVar50);
          lVar41 = (long)local_684;
          v2_04.z = cc.x;
          v2_04.x = (float)auStack_618;
          v2_04.y = cr;
          vVar46 = vec3_sub(vVar50,v2_04);
          vVar46 = vec3_set_length(vVar46,fVar42);
          v1_09.z = cc.x;
          v1_09.x = (float)auStack_618;
          v1_09.y = cr;
          vVar46 = vec3_add(v1_09,vVar46);
          circle_p[lVar41].x = vVar46.z;
          *(long *)(&closest_dist_1 + lVar41 * 3) = vVar46._0_8_;
          uVar8 = circle_p0[(long)local_684 + -1].y;
          uVar21 = circle_p0[(long)local_684 + -1].z;
          v1_08.y = (float)uVar21;
          v1_08.x = (float)uVar8;
          v1_08.z = circle_p0[local_684].x;
          v2_03.z = cc.x;
          v2_03.x = (float)auStack_618;
          v2_03.y = cr;
          vVar46 = vec3_sub(v1_08,v2_03);
          v1_07.z = circle_p[local_684].x;
          v1_07.x = (&closest_dist_1 + (long)local_684 * 3)[0];
          v1_07.y = (&closest_dist_1 + (long)local_684 * 3)[1];
          v2_02.z = cc.x;
          v2_02.x = (float)auStack_618;
          v2_02.y = cr;
          vVar47 = vec3_sub(v1_07,v2_02);
          r_axis._4_8_ = vVar47._0_8_;
          qVar52 = quat_between_vectors(vVar46,vVar47);
          quat_get_axis_angle(qVar52,(vec3 *)&screen_dist_1,&local_988);
          if ((local_988 <= 1.5707964) && (-1.5707964 <= local_988)) {
            vVar30 = _world_to_screen(vVar50);
            p_01.z = circle_p[local_684].x;
            p_01.x = (&closest_dist_1 + (long)local_684 * 3)[0];
            p_01.y = (&closest_dist_1 + (long)local_684 * 3)[1];
            vVar31 = _world_to_screen(p_01);
            fVar43 = vec2_distance(vVar30,vVar31);
            if (fVar43 < local_680) {
              i_2 = local_684;
              local_680 = fVar43;
            }
          }
        }
      }
      dir0_1.z = -NAN;
      if (local_680 < 8.0) {
        dir0_1.z = (float)i_2;
      }
      if ((gizmo->is_active & 1U) == 0) {
        if ((-1 < (int)dir0_1.z) && ((pgVar39->mouse_down[0] & 1U) != 0)) {
          gizmo->is_active = true;
          (gizmo->rotate).axis = (int)dir0_1.z;
          (gizmo->rotate).axis_rotation.z = axis[(int)dir0_1.z].x;
          fVar43 = axis[(long)(int)dir0_1.z + -1].z;
          (gizmo->rotate).axis_rotation.x = axis[(long)(int)dir0_1.z + -1].y;
          (gizmo->rotate).axis_rotation.y = fVar43;
          (gizmo->rotate).start_point.z = circle_p[(int)dir0_1.z].x;
          fVar43 = (&closest_dist_1 + (long)(int)dir0_1.z * 3)[1];
          (gizmo->rotate).start_point.x = (&closest_dist_1 + (long)(int)dir0_1.z * 3)[0];
          (gizmo->rotate).start_point.y = fVar43;
          fVar43 = (gizmo->transform).rotation.y;
          fVar42 = (gizmo->transform).rotation.z;
          fVar44 = (gizmo->transform).rotation.w;
          (gizmo->rotate).start_rotation.x = (gizmo->transform).rotation.x;
          (gizmo->rotate).start_rotation.y = fVar43;
          (gizmo->rotate).start_rotation.z = fVar42;
          (gizmo->rotate).start_rotation.w = fVar44;
          vVar48 = vec3_create(0.0,0.0,0.0);
          vVar49 = vec3_create(0.0,0.0,0.0);
          qVar52 = quat_create(0.0,0.0,0.0,1.0);
          golf_transform(&local_d28,vVar48,vVar49,qVar52);
          memcpy(&gizmo->delta_transform,&local_d28,0x28);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if ((pgVar39->mouse_down[0] & 1U) == 0) {
          gizmo->is_active = false;
        }
        iVar4 = (gizmo->rotate).axis;
        v2_01.z = cc.x;
        v2_01.x = (float)auStack_618;
        v2_01.y = cr;
        vVar48 = vec3_sub((gizmo->rotate).start_point,v2_01);
        vVar48 = vec3_normalize(vVar48);
        lVar41 = (long)iVar4;
        v1_06.z = circle_p[lVar41].x;
        v1_06.x = (&closest_dist_1 + lVar41 * 3)[0];
        v1_06.y = (&closest_dist_1 + lVar41 * 3)[1];
        v2_00.z = cc.x;
        v2_00.x = (float)auStack_618;
        v2_00.y = cr;
        vVar49 = vec3_sub(v1_06,v2_00);
        vVar49 = vec3_normalize(vVar49);
        r_axis_1._4_8_ = vVar49._0_8_;
        qVar52 = quat_between_vectors(vVar48,vVar49);
        quat_get_axis_angle(qVar52,(vec3 *)auStack_ae4,&local_ae8);
        if ((local_ae8 != 0.0) || (NAN(local_ae8))) {
          v1_05.z = r_axis_1.x;
          v1_05.x = (float)auStack_ae4;
          v1_05.y = r_angle_1;
          fVar43 = vec3_dot(v1_05,(gizmo->rotate).axis_rotation);
          if (fVar43 < 0.0) {
            local_ae8 = local_ae8 * -1.0;
          }
          local_ae8 = golf_snapf(local_ae8,(gizmo->rotate).snap * 0.017453292);
          qVar52 = quat_create_from_axis_angle((gizmo->rotate).axis_rotation,local_ae8);
          qVar53 = quat_multiply(qVar52,(gizmo->rotate).start_rotation);
          (gizmo->transform).rotation.x = (float)(int)qVar53._0_8_;
          (gizmo->transform).rotation.y = (float)(int)((ulong)qVar53._0_8_ >> 0x20);
          (gizmo->transform).rotation.z = (float)(int)qVar53._8_8_;
          (gizmo->transform).rotation.w = (float)(int)((ulong)qVar53._8_8_ >> 0x20);
          (gizmo->delta_transform).rotation.x = (float)(int)qVar52._0_8_;
          (gizmo->delta_transform).rotation.y = (float)(int)((ulong)qVar52._0_8_ >> 0x20);
          (gizmo->delta_transform).rotation.z = (float)(int)qVar52._8_8_;
          (gizmo->delta_transform).rotation.w = (float)(int)((ulong)qVar52._8_8_ >> 0x20);
        }
        points[0x18].y = 3.50325e-44;
        p_00.z = cc.x;
        p_00.x = (float)auStack_618;
        p_00.y = cr;
        local_c08 = _world_to_screen(p_00);
        for (local_c24 = 1; local_c24 < (int)points[0x18].y; local_c24 = local_c24 + 1) {
          vVar49 = vec3_rotate_about_axis
                             (vVar48,(gizmo->rotate).axis_rotation,
                              local_ae8 *
                              ((float)(local_c24 + -1) / (float)((int)points[0x18].y + -2)));
          vVar49 = vec3_scale(vVar49,fVar42);
          v1_04.z = cc.x;
          v1_04.x = (float)auStack_618;
          v1_04.y = cr;
          vVar49 = vec3_add(v1_04,vVar49);
          col_1._8_8_ = vVar49._0_8_;
          vVar30 = _world_to_screen(vVar49);
          points[(long)local_c24 + -1] = vVar30;
        }
        vVar51 = vec4_create(1.0,1.0,1.0,0.4);
        col_1._0_8_ = vVar51._8_8_;
        local_d00 = vVar51._0_8_;
        _add_convex_poly(draw_list,&local_c08,(int)points[0x18].y,vVar51);
      }
      for (col_2.z = 0.0; (int)col_2.z < 3; col_2.z = (float)((int)col_2.z + 1)) {
        local_dac = *(undefined8 *)(&closest_dist + (long)(int)col_2.z * 4);
        col_2.x = color[(int)col_2.z].x;
        col_2.y = color[(int)col_2.z].y;
        if ((((gizmo->is_active & 1U) == 0) && (col_2.z == dir0_1.z)) ||
           (((gizmo->is_active & 1U) != 0 && (col_2.z == (float)(gizmo->rotate).axis)))) {
          vVar51 = vec4_create(1.0,1.0,0.0,1.0);
          col_2._0_8_ = vVar51._8_8_;
          local_dac = vVar51._0_8_;
        }
        uVar9 = circle_p0[(long)(int)col_2.z + -1].y;
        uVar22 = circle_p0[(long)(int)col_2.z + -1].z;
        v1_03.y = (float)uVar22;
        v1_03.x = (float)uVar9;
        fVar43 = circle_p0[(int)col_2.z].x;
        for (t1 = 0.0; (int)t1 < 0x14; t1 = (float)((int)t1 + 1)) {
          fVar42 = ((float)(int)t1 / 20.0) * 1.5707964;
          fVar44 = ((float)((int)t1 + 1) / 20.0) * 1.5707964;
          v1_03.z = fVar43;
          v2.z = cc.x;
          v2.x = (float)auStack_618;
          v2.y = cr;
          vVar48 = vec3_sub(v1_03,v2);
          uVar10 = axis[(long)(int)col_2.z + -1].y;
          uVar23 = axis[(long)(int)col_2.z + -1].z;
          axis_03.y = (float)uVar23;
          axis_03.x = (float)uVar10;
          axis_03.z = axis[(int)col_2.z].x;
          vVar49 = vec3_rotate_about_axis(vVar48,axis_03,fVar42);
          v1_02.z = cc.x;
          v1_02.x = (float)auStack_618;
          v1_02.y = cr;
          vVar49 = vec3_add(v1_02,vVar49);
          vVar30 = _world_to_screen(vVar49);
          uVar11 = axis[(long)(int)col_2.z + -1].y;
          uVar24 = axis[(long)(int)col_2.z + -1].z;
          axis_02.y = (float)uVar24;
          axis_02.x = (float)uVar11;
          axis_02.z = axis[(int)col_2.z].x;
          vVar49 = vec3_rotate_about_axis(vVar48,axis_02,fVar44);
          v1_01.z = cc.x;
          v1_01.x = (float)auStack_618;
          v1_01.y = cr;
          vVar49 = vec3_add(v1_01,vVar49);
          vVar31 = _world_to_screen(vVar49);
          color_01.z = col_2.x;
          color_01.w = col_2.y;
          color_01.x = (float)(undefined4)local_dac;
          color_01.y = (float)local_dac._4_4_;
          _add_line(draw_list,vVar30,vVar31,4.0,color_01);
          uVar12 = axis[(long)(int)col_2.z + -1].y;
          uVar25 = axis[(long)(int)col_2.z + -1].z;
          axis_01.y = (float)uVar25;
          axis_01.x = (float)uVar12;
          axis_01.z = axis[(int)col_2.z].x;
          vVar49 = vec3_rotate_about_axis(vVar48,axis_01,-fVar42);
          v1_00.z = cc.x;
          v1_00.x = (float)auStack_618;
          v1_00.y = cr;
          vVar49 = vec3_add(v1_00,vVar49);
          vVar30 = _world_to_screen(vVar49);
          uVar13 = axis[(long)(int)col_2.z + -1].y;
          uVar26 = axis[(long)(int)col_2.z + -1].z;
          axis_00.y = (float)uVar26;
          axis_00.x = (float)uVar13;
          axis_00.z = axis[(int)col_2.z].x;
          vVar48 = vec3_rotate_about_axis(vVar48,axis_00,-fVar44);
          v1.z = cc.x;
          v1.x = (float)auStack_618;
          v1.y = cr;
          vVar48 = vec3_add(v1,vVar48);
          vVar31 = _world_to_screen(vVar48);
          color_02.z = col_2.x;
          color_02.w = col_2.y;
          color_02.x = (float)(undefined4)local_dac;
          color_02.y = (float)local_dac._4_4_;
          _add_line(draw_list,vVar30,vVar31,4.0,color_02);
        }
      }
    }
    else if (gizmo->operation == GOLF_GIZMO_SCALE) {
      local_107c = -NAN;
      closest_point_1[2].z = 3.4028235e+38;
      for (p1_3.y = 0.0; (int)p1_3.y < 3; p1_3.y = (float)((int)p1_3.y + 1)) {
        p1_3.x = (pgVar39->mouse_ray_orig).z;
        pvVar2 = &pgVar39->mouse_ray_orig;
        uVar14 = pvVar2->x;
        uVar27 = pvVar2->y;
        vVar35.y = (float)uVar27;
        vVar35.x = (float)uVar14;
        vVar48 = vec3_add(*pvVar2,pgVar39->mouse_ray_dir);
        uVar15 = axis[(long)(int)p1_3.y + -1].y;
        uVar28 = axis[(long)(int)p1_3.y + -1].z;
        vVar50.y = (float)uVar28;
        vVar50.x = (float)uVar15;
        vVar50.z = axis[(int)p1_3.y].x;
        vVar49 = vec3_scale(vVar50,fVar42);
        vVar49 = vec3_add(vVar46,vVar49);
        vVar35.z = p1_3.x;
        closest_point_ray_ray
                  (vVar35,vVar48,vVar47,vVar49,&c1_1.z,&c1_1.y,(vec3 *)&c2_1.y,(vec3 *)local_1198);
        vVar49.z = c1_1.x;
        vVar49.x = c2_1.y;
        vVar49.y = c2_1.z;
        vVar30 = _world_to_screen(vVar49);
        vVar48.z = c2_1.x;
        vVar48.x = (float)local_1198._0_4_;
        vVar48.y = (float)local_1198._4_4_;
        vVar31 = _world_to_screen(vVar48);
        fVar43 = vec2_distance(vVar30,vVar31);
        if (((0.0 <= c1_1.y) && (c1_1.y <= 1.4)) && (fVar43 < closest_point_1[2].z)) {
          closest_point_1[2].z = fVar43;
          local_107c = p1_3.y;
        }
        *(undefined1 (*) [8])&(&p1_3)[(int)p1_3.y].z = local_1198;
        closest_point_1[(int)p1_3.y].x = c2_1.x;
      }
      local_1214 = -NAN;
      if (closest_point_1[2].z < 8.0) {
        local_1214 = local_107c;
      }
      if ((gizmo->is_active & 1U) == 0) {
        if ((-1 < (int)local_1214) && ((pgVar39->mouse_down[0] & 1U) != 0)) {
          gizmo->is_active = true;
          (gizmo->scale).axis = (int)local_1214;
          (gizmo->scale).start_point.z = closest_point_1[(int)local_1214].x;
          uVar17 = *(undefined8 *)&(&p1_3)[(int)local_1214].z;
          (gizmo->scale).start_point.x = (float)(int)uVar17;
          (gizmo->scale).start_point.y = (float)(int)((ulong)uVar17 >> 0x20);
          (gizmo->scale).start_scale.z = (gizmo->transform).scale.z;
          fVar43 = (gizmo->transform).scale.y;
          (gizmo->scale).start_scale.x = (gizmo->transform).scale.x;
          (gizmo->scale).start_scale.y = fVar43;
          vVar48 = vec3_create(0.0,0.0,0.0);
          vVar49 = vec3_create(0.0,0.0,0.0);
          qVar52 = quat_create(0.0,0.0,0.0,1.0);
          golf_transform(&local_12f0,vVar48,vVar49,qVar52);
          memcpy(&gizmo->delta_transform,&local_12f0,0x28);
        }
      }
      else {
        igCaptureMouseFromApp(true);
        if ((pgVar39->mouse_down[0] & 1U) == 0) {
          gizmo->is_active = false;
        }
        scale.z = (float)(gizmo->scale).axis;
        local_1230 = closest_point_1[(int)scale.z].x;
        local_1238 = *(undefined8 *)&(&p1_3)[(int)scale.z].z;
        vVar46.z = local_1230;
        vVar46.x = (float)(int)local_1238;
        vVar46.y = (float)(int)((ulong)local_1238 >> 0x20);
        local_1240 = (gizmo->scale).start_point.z;
        pvVar2 = &(gizmo->scale).start_point;
        local_1248._0_4_ = pvVar2->x;
        local_1248._4_4_ = pvVar2->y;
        vVar48 = vec3_sub(vVar46,*pvVar2);
        local_1270 = vVar48.z;
        local_1278 = vVar48._0_8_;
        local_1258 = local_1278;
        local_1250 = local_1270;
        local_1228 = local_1278;
        scale.x = local_1270;
        vVar48 = vec3_snap(vVar48,(gizmo->scale).snap);
        local_12b0 = vVar48.z;
        local_12b8 = vVar48._0_8_;
        local_12a0 = (gizmo->scale).start_scale.z;
        pvVar2 = &(gizmo->scale).start_scale;
        local_12a8._0_4_ = pvVar2->x;
        local_12a8._4_4_ = pvVar2->y;
        local_1288 = local_12b8;
        local_1280 = local_12b0;
        local_1268 = local_12b8;
        local_1260 = local_12b0;
        local_1228 = local_12b8;
        scale.x = local_12b0;
        vVar48 = vec3_add(*pvVar2,vVar48);
        local_12c0 = vVar48.z;
        local_12c8 = vVar48._0_8_;
        (gizmo->transform).scale.x = (float)(int)local_12c8;
        (gizmo->transform).scale.y = (float)(int)((ulong)local_12c8 >> 0x20);
        (gizmo->transform).scale.z = local_12c0;
        (gizmo->delta_transform).scale.x = (float)(undefined4)local_1228;
        (gizmo->delta_transform).scale.y = (float)local_1228._4_4_;
        (gizmo->delta_transform).scale.z = scale.x;
        local_1294 = local_12c8;
        local_128c = local_12c0;
      }
      for (p0_2.x = 0.0; (int)p0_2.x < 3; p0_2.x = (float)((int)p0_2.x + 1)) {
        vVar30 = _world_to_screen(vVar36);
        uVar16 = axis[(long)(int)p0_2.x + -1].y;
        uVar29 = axis[(long)(int)p0_2.x + -1].z;
        vVar47.y = (float)uVar29;
        vVar47.x = (float)uVar16;
        vVar47.z = axis[(int)p0_2.x].x;
        vVar48 = vec3_scale(vVar47,fVar42);
        vVar48 = vec3_add(vVar37,vVar48);
        vVar31 = _world_to_screen(vVar48);
        local_141c = *(undefined8 *)(&closest_dist + (long)(int)p0_2.x * 4);
        col_3.x = color[(int)p0_2.x].x;
        col_3.y = color[(int)p0_2.x].y;
        if ((((gizmo->is_active & 1U) == 0) && (local_1214 == p0_2.x)) ||
           (((gizmo->is_active & 1U) != 0 && (p0_2.x == (float)(gizmo->scale).axis)))) {
          vVar51 = vec4_create(1.0,1.0,0.0,1.0);
          col_3._0_8_ = vVar51._8_8_;
          local_141c = vVar51._0_8_;
        }
        vVar51.z = col_3.x;
        vVar51.w = col_3.y;
        vVar51.x = (float)(undefined4)local_141c;
        vVar51.y = (float)local_141c._4_4_;
        _add_line(draw_list,vVar30,vVar31,4.0,vVar51);
        color_00.z = col_3.x;
        color_00.w = col_3.y;
        color_00.x = (float)(undefined4)local_141c;
        color_00.y = (float)local_141c._4_4_;
        _add_circle(draw_list,vVar31,7.5,color_00);
      }
    }
  }
  return;
}

Assistant:

void golf_gizmo_update(golf_gizmo_t *gizmo, ImDrawList *draw_list) {
    if (!gizmo->is_on) {
        return;
    }

    golf_inputs_t *inputs = golf_inputs_get();
    golf_graphics_t *graphics = golf_graphics_get();

    vec3 p = gizmo->transform.position;
    float dist_modifier = 0.1f * vec3_distance(graphics->cam_pos, p);

    mat4 model_mat = mat4_from_quat(gizmo->transform.rotation);
    vec3 axis[3] = {
        vec3_apply_mat4(V3(1, 0, 0), 0, model_mat),
        vec3_apply_mat4(V3(0, 1, 0), 0, model_mat),
        vec3_apply_mat4(V3(0, 0, 1), 0, model_mat),
    };
    vec4 color[3] = { 
        V4(1, 0, 0, 1),
        V4(0, 1, 0, 1),
        V4(0, 0, 1, 1) 
    };

    if (gizmo->operation == GOLF_GIZMO_TRANSLATE) {
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        vec3 closest_point[3];
        for (int i = 0; i < 3; i++) {
            vec3 p1 = inputs->mouse_ray_orig;
            vec3 q1 = vec3_add(p1, inputs->mouse_ray_dir);
            vec3 p2 = p;
            vec3 q2 = vec3_add(p2, vec3_scale(axis[i], dist_modifier));
            float s, t;
            vec3 c1, c2;
            closest_point_ray_ray(p1, q1, p2, q2, &s, &t, &c1, &c2);
            float screen_dist = vec2_distance(_world_to_screen(c1), _world_to_screen(c2));
            if (t >= 0 && t <= 1.4f && screen_dist < closest_dist) {
                closest_dist = screen_dist;
                closest_axis = i;
            }
            closest_point[i] = c2;
        }

        int hovered_axis = -1;
        if (closest_dist < 8) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->translate.axis;
            vec3 translate = vec3_sub(closest_point[axis_i], gizmo->translate.start_point);
            float dist = golf_snapf(vec3_length(translate), gizmo->translate.snap);
            translate = vec3_set_length(translate, dist);
            gizmo->transform.position = vec3_add(gizmo->translate.start_position, translate);
            gizmo->delta_transform.position = translate;
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->translate.axis = hovered_axis;
                gizmo->translate.start_point = closest_point[hovered_axis];
                gizmo->translate.start_position = gizmo->transform.position;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec2 p0 = _world_to_screen(p);
            vec2 p1 = _world_to_screen(vec3_add(p, vec3_scale(axis[i], dist_modifier)));
            float thickness = 4;
            vec4 col = color[i];
            if ((!gizmo->is_active && hovered_axis == i) ||
                    (gizmo->is_active && i == gizmo->translate.axis)){
                col = V4(1, 1, 0, 1);
            }
            _add_line(draw_list, p0, p1, thickness, col);

            float w = 15;
            float h = sqrtf(3.0f) / 2.0f * w;
            vec2 dir0 = vec2_normalize(vec2_sub(p1, p0));
            vec2 dir1 = vec2_rotate(dir0, 0.5f * MF_PI);
            vec2 t_p0 = vec2_add(p1, vec2_add(vec2_scale(dir0, -0.5f * h), vec2_scale(dir1, -0.5f * w)));
            vec2 t_p1 = vec2_add(p1, vec2_add(vec2_scale(dir0, -0.5f * h), vec2_scale(dir1, 0.5f * w)));
            vec2 t_p2 = vec2_add(p1, vec2_scale(dir0, 0.5f * h));
            _add_triangle(draw_list, t_p0, t_p1, t_p2, col);
        }
    }
    else if (gizmo->operation == GOLF_GIZMO_ROTATE) {
        vec3 ro = inputs->mouse_ray_orig;
        vec3 rd = inputs->mouse_ray_dir;
        vec3 cc = p;
        float cr = 1 * dist_modifier;

        vec3 circle_p0[3], circle_p[3];
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        for (int i = 0; i < 3; i++) {
            circle_p0[i] = closest_point_point_plane(ro, cc, axis[i]);
            circle_p0[i] = vec3_add(cc, vec3_set_length(vec3_sub(circle_p0[i], cc), cr));

            float t;
            int idx;
            if (!ray_intersect_planes(ro, rd, &cc, &axis[i], 1, &t, &idx)) {
                continue;
            }

            vec3 plane_p = vec3_add(ro, vec3_scale(rd, t));
            circle_p[i] = vec3_add(cc, vec3_set_length(vec3_sub(plane_p, cc), cr));

            quat r = quat_between_vectors(vec3_sub(circle_p0[i], cc), vec3_sub(circle_p[i], cc));
            vec3 r_axis;
            float r_angle;
            quat_get_axis_angle(r, &r_axis, &r_angle);
            if (r_angle > 0.5f * MF_PI || r_angle < -0.5f * MF_PI) {
                continue;
            }

            float screen_dist = vec2_distance(_world_to_screen(plane_p), _world_to_screen(circle_p[i]));
            if (screen_dist < closest_dist) {
                closest_axis = i;
                closest_dist = screen_dist;
            }
        }

        float hover_dist = 8;
        int hovered_axis = -1;
        if (closest_dist < hover_dist) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->rotate.axis;
            vec3 dir0 = vec3_normalize(vec3_sub(gizmo->rotate.start_point, cc));
            vec3 dir1 = vec3_normalize(vec3_sub(circle_p[axis_i], cc));
            quat r = quat_between_vectors(dir0, dir1);
            vec3 r_axis;
            float r_angle;
            quat_get_axis_angle(r, &r_axis, &r_angle);

            if (r_angle != 0) {
                if (vec3_dot(r_axis, gizmo->rotate.axis_rotation) < 0.0f) {
                    r_angle *= -1.0f;
                }
                r_angle = golf_snapf(r_angle, gizmo->rotate.snap * (MF_PI / 180.0f));
                quat rotation = quat_create_from_axis_angle(gizmo->rotate.axis_rotation, r_angle);
                gizmo->transform.rotation = quat_multiply(rotation, gizmo->rotate.start_rotation);
                gizmo->delta_transform.rotation = rotation;
            }

            int num_points = 25;
            vec2 points[25];
            points[0] = _world_to_screen(cc);
            for (int i = 1; i < num_points; i++) {
                float t = r_angle * ((float)(i - 1) / (num_points - 2));
                vec3 p = vec3_add(cc, vec3_scale(vec3_rotate_about_axis(dir0, gizmo->rotate.axis_rotation, t), cr));
                points[i] = _world_to_screen(p);
            }
            vec4 col = V4(1, 1, 1, 0.4f);
            _add_convex_poly(draw_list, points, num_points, col);
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->rotate.axis = hovered_axis;
                gizmo->rotate.axis_rotation = axis[hovered_axis];
                gizmo->rotate.start_point = circle_p[hovered_axis];
                gizmo->rotate.start_rotation = gizmo->transform.rotation;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec4 col = color[i];
            if ((!gizmo->is_active && i == hovered_axis) ||
                    (gizmo->is_active && i == gizmo->rotate.axis)) {
                col = V4(1, 1, 0, 1);
            }
            float thickness = 4;
            int n = 20;
            vec3 pt = circle_p0[i];
            for (int j = 0; j < n; j++) {
                float t0 = 0.5f * MF_PI * ((float) j / n);
                float t1 = 0.5f * MF_PI * ((float) (j + 1) / n);
                vec3 dir = vec3_sub(pt, cc);
                vec2 p0 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], t0)));
                vec2 p1 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], t1)));
                _add_line(draw_list, p0, p1, thickness, col); 

                p0 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], -t0)));
                p1 = _world_to_screen(vec3_add(cc, vec3_rotate_about_axis(dir, axis[i], -t1)));
                _add_line(draw_list, p0, p1, thickness, col); 
            }
        }
    }
    else if (gizmo->operation == GOLF_GIZMO_SCALE) {
        int closest_axis = -1;
        float closest_dist = FLT_MAX;
        vec3 closest_point[3];
        for (int i = 0; i < 3; i++) {
            vec3 p1 = inputs->mouse_ray_orig;
            vec3 q1 = vec3_add(p1, inputs->mouse_ray_dir);
            vec3 p2 = p;
            vec3 q2 = vec3_add(p2, vec3_scale(axis[i], dist_modifier));
            float s, t;
            vec3 c1, c2;
            closest_point_ray_ray(p1, q1, p2, q2, &s, &t, &c1, &c2);
            float screen_dist = vec2_distance(_world_to_screen(c1), _world_to_screen(c2));
            if (t >= 0 && t <= 1.4f && screen_dist < closest_dist) {
                closest_dist = screen_dist;
                closest_axis = i;
            }
            closest_point[i] = c2;
        }

        int hovered_axis = -1;
        if (closest_dist < 8) {
            hovered_axis = closest_axis;
        }

        if (gizmo->is_active) {
            igCaptureMouseFromApp(true);
            if (!inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = false;
            }

            int axis_i = gizmo->scale.axis;
            vec3 scale = vec3_sub(closest_point[axis_i], gizmo->scale.start_point);
            scale = vec3_snap(scale, gizmo->scale.snap);
            gizmo->transform.scale = vec3_add(gizmo->scale.start_scale, scale);
            gizmo->delta_transform.scale = scale;
        }
        else {
            if (hovered_axis >= 0 && inputs->mouse_down[SAPP_MOUSEBUTTON_LEFT]) {
                gizmo->is_active = true;
                gizmo->scale.axis = hovered_axis;
                gizmo->scale.start_point = closest_point[hovered_axis];
                gizmo->scale.start_scale = gizmo->transform.scale;
                gizmo->delta_transform = golf_transform(V3(0, 0, 0), V3(0, 0, 0), QUAT(0, 0, 0, 1));
            }
        }

        for (int i = 0; i < 3; i++) {
            vec2 p0 = _world_to_screen(p);
            vec2 p1 = _world_to_screen(vec3_add(p, vec3_scale(axis[i], dist_modifier)));
            float thickness = 4;
            vec4 col = color[i];
            if ((!gizmo->is_active && hovered_axis == i) ||
                    (gizmo->is_active && i == gizmo->scale.axis)){
                col = V4(1, 1, 0, 1);
            }
            _add_line(draw_list, p0, p1, thickness, col);

            float r = 7.5;
            _add_circle(draw_list, p1, r, col);
        }
    }
}